

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CExpStatement::Copy(CExpStatement *this)

{
  CExpStatement *this_00;
  pointer pCVar1;
  long in_RSI;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_28;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_20 [2];
  CExpStatement *this_local;
  
  this_local = this;
  this_00 = (CExpStatement *)operator_new(0x10);
  pCVar1 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           operator->((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)(in_RSI + 8));
  (*(pCVar1->super_IExpression).super_INode._vptr_INode[3])(&local_28);
  CExpStatement(this_00,&local_28);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             local_20,(pointer)this_00);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)this,
             local_20);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_28);
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CExpStatement::Copy( ) const {
    return std::move( std::unique_ptr<const CStatement>( new CExpStatement( expression->Copy( ))));
}